

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

void Aig_RManTableResize(Aig_RMan_t *p)

{
  uint uVar1;
  Aig_Tru_t **__ptr;
  Aig_Tru_t *pAVar2;
  Aig_Tru_t *pAVar3;
  uint uVar4;
  Aig_Tru_t **ppAVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  timespec ts;
  timespec local_40;
  
  if (p->pBins == (Aig_Tru_t **)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCanon.c"
                  ,0xb4,"void Aig_RManTableResize(Aig_RMan_t *)");
  }
  clock_gettime(3,&local_40);
  __ptr = p->pBins;
  uVar1 = p->nBins;
  uVar6 = uVar1 * 3 - 1;
  while( true ) {
    do {
      uVar7 = uVar6 + 1;
      uVar4 = uVar6 & 1;
      uVar6 = uVar7;
    } while (uVar4 != 0);
    if (uVar7 < 9) break;
    iVar8 = 5;
    while (uVar7 % (iVar8 - 2U) != 0) {
      uVar4 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar7 < uVar4) goto LAB_006b5aaa;
    }
  }
LAB_006b5aaa:
  p->nBins = uVar7;
  ppAVar5 = (Aig_Tru_t **)calloc((long)(int)uVar7,8);
  p->pBins = ppAVar5;
  if ((int)uVar1 < 1) {
    iVar8 = 0;
  }
  else {
    uVar9 = 0;
    iVar8 = 0;
    do {
      pAVar3 = __ptr[uVar9];
      while (pAVar3 != (Aig_Tru_t *)0x0) {
        ppAVar5 = Aig_RManTableLookup(p,(uint *)(pAVar3 + 1),*(uint *)&pAVar3->field_0xc >> 0x1b);
        if (*ppAVar5 != (Aig_Tru_t *)0x0) {
          __assert_fail("*ppPlace == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCanon.c"
                        ,0xc4,"void Aig_RManTableResize(Aig_RMan_t *)");
        }
        pAVar2 = pAVar3->pNext;
        *ppAVar5 = pAVar3;
        pAVar3->pNext = (Aig_Tru_t *)0x0;
        iVar8 = iVar8 + 1;
        pAVar3 = pAVar2;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  if (iVar8 == p->nEntries) {
    if (__ptr != (Aig_Tru_t **)0x0) {
      free(__ptr);
    }
    return;
  }
  __assert_fail("Counter == p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCanon.c"
                ,0xca,"void Aig_RManTableResize(Aig_RMan_t *)");
}

Assistant:

void Aig_RManTableResize( Aig_RMan_t * p )
{
    Aig_Tru_t * pEntry, * pNext;
    Aig_Tru_t ** pBinsOld, ** ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = pBinsOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the Bins 
        ppPlace = Aig_RManTableLookup( p, pEntry->pTruth, pEntry->nVars );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == p->nEntries );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    ABC_FREE( pBinsOld );
}